

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O0

int test2(void)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  size_type sVar4;
  void *ptr;
  undefined1 local_288 [8];
  SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> memCtx;
  
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                   local_288,false);
  bVar1 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
          isStoringExactSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                             &memCtx.
                              super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                              .field_0x10);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_ =
         1;
  }
  else {
    cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::setStoringExactSize
              ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
               &memCtx.super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                field_0x10,true);
    bVar1 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
            isStoringExactSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *
                               )&memCtx.
                                 super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                 .field_0x10);
    if (bVar1) {
      pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                         ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                          &memCtx.
                           super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                           .field_0x10,0x1e);
      if (pvVar3 == (void *)0x0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x47);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
        _580_4_ = 1;
      }
      else {
        memset(pvVar3,0xff,0x1e);
        sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getSize
                          ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                           &memCtx.
                            super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                            .field_0x10,pvVar3);
        if (sVar4 == 0x1e) {
          cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                    ((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                     &memCtx.
                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>.
                      field_0x10,pvVar3,0);
          pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                   allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                            &memCtx.
                             super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                             .field_0x10,300);
          if (pvVar3 == (void *)0x0) {
            poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4d);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
            _580_4_ = 1;
          }
          else {
            memset(pvVar3,0xff,300);
            sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                    getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                            &memCtx.
                             super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                             .field_0x10,pvVar3);
            if (sVar4 == 300) {
              pvVar3 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                       allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                 *)&memCtx.
                                    super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                    .field_0x10,3000);
              if (pvVar3 == (void *)0x0) {
                poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x52);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                m_pool._580_4_ = 1;
              }
              else {
                memset(pvVar3,0xff,3000);
                sVar4 = cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                        ::getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                   *)&memCtx.
                                      super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                      .field_0x10,pvVar3);
                if (sVar4 == 3000) {
                  pvVar3 = cookmem::
                           MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                           allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     *)&memCtx.
                                        super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                        .field_0x10,30000);
                  if (pvVar3 == (void *)0x0) {
                    poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x57);
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                    m_pool._580_4_ = 1;
                  }
                  else {
                    memset(pvVar3,0xff,3000);
                    sVar4 = cookmem::
                            MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                            getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     *)&memCtx.
                                        super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                        .field_0x10,pvVar3);
                    if (sVar4 == 30000) {
                      pvVar3 = cookmem::
                               MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                               allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                         *)&memCtx.
                                            super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                            .field_0x10,30000);
                      sVar4 = cookmem::
                              MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                              getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                       *)&memCtx.
                                          super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                          .field_0x10,pvVar3);
                      if (sVar4 == 30000) {
                        memset(pvVar3,0xff,30000);
                        if (pvVar3 == (void *)0x0) {
                          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x5e);
                          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                          memCtx.
                          super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                          m_pool._580_4_ = 1;
                        }
                        else {
                          pvVar3 = cookmem::
                                   MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                   ::allocate((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                               *)&memCtx.
                                                  super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                                  .field_0x10,30000);
                          sVar4 = cookmem::
                                  MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                  ::getSize((MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                             *)&memCtx.
                                                super_SimpleMemContainer<cookmem::MallocArena,_cookmem::NoActionMemLogger>
                                                .field_0x10,pvVar3);
                          if (sVar4 == 30000) {
                            memset(pvVar3,0xff,30000);
                            if (pvVar3 == (void *)0x0) {
                              poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                              poVar2 = (ostream *)std::ostream::operator<<(poVar2,99);
                              std::ostream::operator<<
                                        (poVar2,std::endl<char,std::char_traits<char>>);
                              memCtx.
                              super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                              .m_pool._580_4_ = 1;
                            }
                            else {
                              memCtx.
                              super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                              .m_pool._580_4_ = 0;
                            }
                          }
                          else {
                            poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x61);
                            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                            memCtx.
                            super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                            .m_pool._580_4_ = 1;
                          }
                        }
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x5c);
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        memCtx.
                        super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                        m_pool._580_4_ = 1;
                      }
                    }
                    else {
                      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x59);
                      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                      memCtx.
                      super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                      m_pool._580_4_ = 1;
                    }
                  }
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x54);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.
                  m_pool._580_4_ = 1;
                }
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4f);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool
              ._580_4_ = 1;
            }
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x49);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
          _580_4_ = 1;
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool._580_4_
           = 1;
    }
  }
  cookmem::SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
  ~SimpleMemContext((SimpleMemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *)
                    local_288);
  return memCtx.super_MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>.m_pool.
         _580_4_;
}

Assistant:

static int
test2 ()
{
    cookmem::SimpleMemContext<cookmem::MallocArena> memCtx;

    ASSERT_EQ (false, memCtx.isStoringExactSize ());
    memCtx.setStoringExactSize (true);
    ASSERT_EQ (true, memCtx.isStoringExactSize ());

    void* ptr;

    ptr = memCtx.allocate (30);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 30);
    ASSERT_EQ (30, memCtx.getSize (ptr));
    memCtx.deallocate (ptr);

    ptr = memCtx.allocate (300);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 300);
    ASSERT_EQ (300, memCtx.getSize (ptr));

    ptr = memCtx.allocate (3000);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 3000);
    ASSERT_EQ (3000, memCtx.getSize (ptr));

    ptr = memCtx.allocate (30000);
    ASSERT_NE (nullptr, ptr);
    memset (ptr, 0xff, 3000);
    ASSERT_EQ (30000, memCtx.getSize (ptr));

    ptr = memCtx.allocate (30000);
    ASSERT_EQ (30000, memCtx.getSize (ptr));
    memset (ptr, 0xff, 30000);
    ASSERT_NE (nullptr, ptr);

    ptr = memCtx.allocate (30000);
    ASSERT_EQ (30000, memCtx.getSize (ptr));
    memset (ptr, 0xff, 30000);
    ASSERT_NE (nullptr, ptr);

    return 0;
}